

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_tar_acl.c
# Opt level: O1

void test_compat_solaris_tar_acl(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive *paVar4;
  int type;
  char *name;
  archive_entry *ae;
  int tag;
  int permset;
  int qual;
  wchar_t local_5c;
  char *local_58;
  archive_entry *local_50;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  archive *local_38;
  
  extract_reference_file("test_compat_solaris_tar_acl.tar");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'.',(uint)(paVar4 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'/',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'0',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar4);
  wVar2 = archive_read_open_filename(paVar4,"test_compat_solaris_tar_acl.tar",0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'1',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, reference1, 512)",paVar4);
  local_38 = paVar4;
  iVar1 = archive_read_next_header(paVar4,&local_50);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'4',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
  mVar3 = archive_entry_mode(local_50);
  failure("Basic ACLs should set mode to 0644, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'7',(ulong)(mVar3 & 0x1ff),"(archive_entry_mode(ae) & 0777)",0x1a4,"0644",
                      (void *)0x0);
  wVar2 = archive_entry_acl_reset(local_50,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'9',7,"7",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'<',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'=',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'>',6,"006",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'?',0x2712,"ARCHIVE_ENTRY_ACL_USER_OBJ",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'@',-1,"-1",(long)local_3c,"qual",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'A',(uint)(local_58 == (char *)0x0),"name == NULL",(void *)0x0);
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'E',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'F',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'G',4,"004",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'H',0x2714,"ARCHIVE_ENTRY_ACL_GROUP_OBJ",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'I',-1,"-1",(long)local_3c,"qual",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'J',(uint)(local_58 == (char *)0x0),"name == NULL",(void *)0x0);
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'N',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'O',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'P',4,"004",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Q',0x2716,"ARCHIVE_ENTRY_ACL_OTHER",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'R',-1,"-1",(long)local_3c,"qual",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'S',(uint)(local_58 == (char *)0x0),"name == NULL",(void *)0x0);
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'W',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'X',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Y',1,"001",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Z',0x2711,"ARCHIVE_ENTRY_ACL_USER",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'[',0x47,"71",(long)local_3c,"qual",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'\\',local_58,"name","lp","\"lp\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'`',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'a',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'b',4,"004",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'c',0x2711,"ARCHIVE_ENTRY_ACL_USER",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'd',0x29a,"666",(long)local_3c,"qual",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'e',local_58,"name","666","\"666\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'i',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'j',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'k',7,"007",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'l',0x2711,"ARCHIVE_ENTRY_ACL_USER",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'm',1000,"1000",(long)local_3c,"qual",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'n',local_58,"name","trasz","\"trasz\"",(void *)0x0,L'\0');
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'r',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L's',0x100,"ARCHIVE_ENTRY_ACL_TYPE_ACCESS",(long)local_5c,"type",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L't',4,"004",(long)local_40,"permset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'u',0x2715,"ARCHIVE_ENTRY_ACL_MASK",(long)local_44,"tag",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'v',-1,"-1",(long)local_3c,"qual",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'w',local_58,"name",(char *)0x0,"NULL",(void *)0x0,L'\0');
  wVar2 = archive_entry_acl_next(local_50,L'Ā',&local_5c,&local_40,&local_44,&local_3c,&local_58);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'{',1,"ARCHIVE_EOF",(long)wVar2,
                      "archive_entry_acl_next(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS, &type, &permset, &tag, &qual, &name)"
                      ,(void *)0x0);
  paVar4 = local_38;
  iVar1 = archive_read_close(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_solaris_tar_acl)
{
	struct archive *a;
	struct archive_entry *ae;
	const char *reference1 = "test_compat_solaris_tar_acl.tar";
	int type, permset, tag, qual;
	const char *name;

	/* Sample file generated on Solaris 10 */
	extract_reference_file(reference1);
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_filename(a, reference1, 512));

	/* Archive has 1 entry with some ACLs set on it. */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("Basic ACLs should set mode to 0644, not %04o",
	    archive_entry_mode(ae)&0777);
	assertEqualInt((archive_entry_mode(ae) & 0777), 0644);
	assertEqualInt(7, archive_entry_acl_reset(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(006, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER_OBJ, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_GROUP_OBJ, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_OTHER, tag);
	assertEqualInt(-1, qual);
	assert(name == NULL);

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(001, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(71, qual);
	assertEqualString(name, "lp");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(666, qual);
	assertEqualString(name, "666");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(007, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_USER, tag);
	assertEqualInt(1000, qual);
	assertEqualString(name, "trasz");

	assertEqualInt(ARCHIVE_OK, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));
	assertEqualInt(ARCHIVE_ENTRY_ACL_TYPE_ACCESS, type);
	assertEqualInt(004, permset);
	assertEqualInt(ARCHIVE_ENTRY_ACL_MASK, tag);
	assertEqualInt(-1, qual);
	assertEqualString(name, NULL);

	assertEqualInt(ARCHIVE_EOF, archive_entry_acl_next(ae,
		ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
		&type, &permset, &tag, &qual, &name));

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}